

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O2

void ftl2c_(int *A1,char *A2,int *A3,size_t C2)

{
  int lval;
  char *s;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char str [21];
  
  lval = *A1;
  sVar2 = gMinStrLen;
  if (gMinStrLen <= C2) {
    sVar2 = C2;
  }
  s = (char *)malloc(sVar2 + 1);
  s[C2] = '\0';
  pcVar3 = A2;
  memcpy(s,A2,C2);
  kill_trailing(s,(char)pcVar3);
  ffl2c(lval,s,A3);
  snprintf(str,0x15,"%20s",s);
  strcpy(s,str);
  sVar1 = strlen(s);
  sVar2 = C2;
  if (sVar1 < C2) {
    sVar2 = sVar1;
  }
  memcpy(A2,s,sVar2);
  if (sVar1 <= C2 && C2 - sVar1 != 0) {
    memset(A2 + sVar1,0x20,C2 - sVar1);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTL2C,ftl2c)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),LOGICAL,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(LOGICAL,1)
   QCF(PSTRING,2)
   QCF(PINT,3)
   char str[21];

   ffl2c( TCF(ftl2c,LOGICAL,1,0) 
          TCF(ftl2c,PSTRING,2,1) 
          TCF(ftl2c,PINT,3,1) );

   snprintf(str,21,"%20s",B2);
   strcpy(B2,str);

   RCF(LOGICAL,1)
   RCF(PSTRING,2)
   RCF(PINT,3)
}